

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vendor.cpp
# Opt level: O0

void __thiscall SimpleVendor::Vend(SimpleVendor *this)

{
  VendorIo *pVVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  SimpleVendor *this_local;
  
  bVar2 = ProcessUserInput(this);
  if (bVar2) {
    pVVar1 = this->vio;
    uVar3 = Vendor::GetBalance(&this->super_Vendor);
    (*pVVar1->_vptr_VendorIo[3])(pVVar1,(ulong)uVar3);
    iVar4 = Vendor::GetBalance(&this->super_Vendor);
    iVar5 = Vendor::GetPrice(&this->super_Vendor);
    if (iVar4 < iVar5) {
      pVVar1 = this->vio;
      iVar4 = Vendor::GetPrice(&this->super_Vendor);
      iVar5 = Vendor::GetBalance(&this->super_Vendor);
      (*pVVar1->_vptr_VendorIo[5])(pVVar1,(ulong)(uint)(iVar4 - iVar5));
    }
    else {
      iVar4 = Vendor::GetBalance(&this->super_Vendor);
      iVar5 = Vendor::GetPrice(&this->super_Vendor);
      Vendor::SetBalance(&this->super_Vendor,iVar4 - iVar5);
      (*this->vio->_vptr_VendorIo[4])();
      DispenseChange(this);
    }
    (*(this->super_Vendor)._vptr_Vendor[1])();
  }
  return;
}

Assistant:

void SimpleVendor::Vend() {
    if (!ProcessUserInput()) return; // if user wants to quit, break out of our recursion
    vio->PrintBalance(GetBalance());
    if (GetBalance() >= GetPrice()) {
        SetBalance(GetBalance() - GetPrice());
        vio->PrintThankYouMessage();
        DispenseChange();
    } else vio->PrintMoreCoinsNeeded(GetPrice() - GetBalance());
    return Vend(); // recursive call
}